

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddRef.c
# Opt level: O2

void Cudd_RecursiveDeref(DdManager *table,DdNode *n)

{
  uint *puVar1;
  int iVar2;
  DdNode **ppDVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  DdNode *pDVar8;
  anon_union_16_2_50f58667_for_type *paVar9;
  
  uVar4 = table->dead;
  uVar5 = table->keys - uVar4;
  if (table->peakLiveNodes < uVar5) {
    table->peakLiveNodes = uVar5;
  }
  ppDVar3 = table->stack;
  pDVar8 = (DdNode *)((ulong)n & 0xfffffffffffffffe);
  iVar6 = 1;
  do {
    if (pDVar8->ref == 1) {
      pDVar8->ref = 0;
      uVar4 = uVar4 + 1;
      table->dead = uVar4;
      if ((ulong)pDVar8->index == 0x7fffffff) {
        puVar1 = &(table->constants).dead;
        *puVar1 = *puVar1 + 1;
        goto LAB_0065c8a9;
      }
      iVar2 = table->perm[pDVar8->index];
      paVar9 = &pDVar8->type;
      iVar7 = iVar6 + 1;
      ppDVar3[iVar6] = (DdNode *)((ulong)(pDVar8->type).kids.E & 0xfffffffffffffffe);
      puVar1 = &table->subtables[iVar2].dead;
      *puVar1 = *puVar1 + 1;
    }
    else {
      pDVar8->ref = pDVar8->ref - 1;
LAB_0065c8a9:
      iVar7 = iVar6 + -1;
      paVar9 = (anon_union_16_2_50f58667_for_type *)(ppDVar3 + (long)iVar6 + -1);
    }
    pDVar8 = (paVar9->kids).T;
    iVar6 = iVar7;
    if (iVar7 == 0) {
      return;
    }
  } while( true );
}

Assistant:

void
Cudd_RecursiveDeref(
  DdManager * table,
  DdNode * n)
{
    DdNode *N;
    int ord;
    DdNodePtr *stack = table->stack;
    int SP = 1;

    unsigned int live = table->keys - table->dead;
    if (live > table->peakLiveNodes) {
        table->peakLiveNodes = live;
    }

    N = Cudd_Regular(n);

    do {
#ifdef DD_DEBUG
        assert(N->ref != 0);
#endif

        if (N->ref == 1) {
            N->ref = 0;
            table->dead++;
#ifdef DD_STATS
            table->nodesDropped++;
#endif
            if (cuddIsConstant(N)) {
                table->constants.dead++;
                N = stack[--SP];
            } else {
                ord = table->perm[N->index];
                stack[SP++] = Cudd_Regular(cuddE(N));
                table->subtables[ord].dead++;
                N = cuddT(N);
            }
        } else {
            cuddSatDec(N->ref);
            N = stack[--SP];
        }
    } while (SP != 0);

}